

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O3

void SetupMapping(aiMaterial *mat,aiTextureMapping mode,aiVector3D *axis)

{
  int iVar1;
  aiMaterialProperty *paVar2;
  aiTextureMapping *paVar3;
  aiMaterialProperty *paVar4;
  char *pcVar5;
  aiMaterialProperty **__dest;
  pointer __src;
  ulong uVar6;
  ulong uVar7;
  vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> p;
  aiMaterialProperty *m;
  aiMaterialProperty *prop;
  vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> local_58;
  aiMaterialProperty *local_40;
  aiMaterialProperty *local_38;
  
  local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
  super__Vector_impl_data._M_start = (aiMaterialProperty **)0x0;
  local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiMaterialProperty **)0x0;
  local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiMaterialProperty **)0x0;
  std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::reserve
            (&local_58,(ulong)(mat->mNumProperties + 1));
  if (mat->mNumProperties != 0) {
    uVar6 = 0;
    do {
      paVar4 = mat->mProperties[uVar6];
      pcVar5 = (paVar4->mKey).data;
      local_38 = paVar4;
      iVar1 = strcmp(pcVar5,"$tex.file");
      if (iVar1 == 0) {
        paVar2 = (aiMaterialProperty *)operator_new(0x420);
        memset((paVar2->mKey).data + 0xd,0x1b,0x3f3);
        paVar2->mSemantic = 0;
        paVar2->mIndex = 0;
        paVar2->mDataLength = 0;
        paVar2->mType = aiPTI_Float;
        paVar2->mData = (char *)0x0;
        (paVar2->mKey).length = 0xc;
        builtin_strncpy((paVar2->mKey).data,"$tex.mapping",0xd);
        paVar2->mIndex = paVar4->mIndex;
        paVar2->mSemantic = paVar4->mSemantic;
        paVar2->mDataLength = 4;
        paVar2->mType = aiPTI_Integer;
        local_40 = paVar2;
        paVar3 = (aiTextureMapping *)operator_new__(4);
        paVar2->mData = (char *)paVar3;
        *paVar3 = mode;
        if (local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>>::
          _M_realloc_insert<aiMaterialProperty*const&>
                    ((vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>> *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_38);
        }
        else {
          *local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = paVar4;
          local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>>::
          _M_realloc_insert<aiMaterialProperty*const&>
                    ((vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>> *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_40);
        }
        else {
          *local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_40;
          local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if ((mode < aiTextureMapping_OTHER) && ((0x16U >> (mode & 0x1f) & 1) != 0)) {
          paVar4 = (aiMaterialProperty *)operator_new(0x420);
          memset((paVar4->mKey).data + 0xd,0x1b,0x3f3);
          paVar4->mSemantic = 0;
          paVar4->mIndex = 0;
          paVar4->mDataLength = 0;
          paVar4->mType = aiPTI_Float;
          paVar4->mData = (char *)0x0;
          (paVar4->mKey).length = 0xc;
          builtin_strncpy((paVar4->mKey).data,"$tex.mapaxis",0xd);
          paVar4->mIndex = local_38->mIndex;
          paVar4->mSemantic = local_38->mSemantic;
          paVar4->mDataLength = 0xc;
          paVar4->mType = aiPTI_Float;
          local_40 = paVar4;
          pcVar5 = (char *)operator_new__(0xc);
          paVar4->mData = pcVar5;
          *(float *)(pcVar5 + 8) = axis->z;
          *(undefined8 *)pcVar5 = *(undefined8 *)axis;
          if (local_58.
              super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_58.
              super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_004270f2;
          std::vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>>::
          _M_realloc_insert<aiMaterialProperty*const&>
                    ((vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>> *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_40);
        }
      }
      else {
        iVar1 = strcmp(pcVar5,"$tex.uvwsrc");
        if (iVar1 == 0) {
          if (paVar4 != (aiMaterialProperty *)0x0) {
            if (paVar4->mData != (char *)0x0) {
              operator_delete__(paVar4->mData);
            }
            paVar4->mData = (char *)0x0;
          }
          operator_delete(paVar4);
        }
        else if (local_58.
                 super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish ==
                 local_58.
                 super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>>::
          _M_realloc_insert<aiMaterialProperty*const&>
                    ((vector<aiMaterialProperty*,std::allocator<aiMaterialProperty*>> *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_38);
        }
        else {
LAB_004270f2:
          *local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = paVar4;
          local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_58.
               super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < mat->mNumProperties);
  }
  if (local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = (long)local_58.
                  super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_58.
                  super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)uVar7 >> 3;
    __dest = mat->mProperties;
    __src = local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (mat->mNumAllocated < uVar6) {
      if (__dest != (aiMaterialProperty **)0x0) {
        operator_delete__(__dest);
        uVar7 = (long)local_58.
                      super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.
                      super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = (long)uVar7 >> 3;
      }
      __src = local_58.
              super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
      __dest = (aiMaterialProperty **)
               operator_new__(-(ulong)((uVar6 & 0x7000000000000000) != 0) | uVar7 * 2);
      mat->mProperties = __dest;
      mat->mNumAllocated = (int)uVar6 * 2;
    }
    mat->mNumProperties = (uint)(uVar7 >> 3);
    memcpy(__dest,__src,uVar7 & 0x7fffffff8);
  }
  if (local_58.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (aiMaterialProperty **)0x0) {
    operator_delete(local_58.
                    super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SetupMapping (aiMaterial* mat, aiTextureMapping mode, const aiVector3D& axis = aiVector3D(0.f,0.f,-1.f))
{
    // Check whether there are texture properties defined - setup
    // the desired texture mapping mode for all of them and ignore
    // all UV settings we might encounter. WE HAVE NO UVS!

    std::vector<aiMaterialProperty*> p;
    p.reserve(mat->mNumProperties+1);

    for (unsigned int i = 0; i < mat->mNumProperties;++i)
    {
        aiMaterialProperty* prop = mat->mProperties[i];
        if (!::strcmp( prop->mKey.data, "$tex.file"))   {
            // Setup the mapping key
            aiMaterialProperty* m = new aiMaterialProperty();
            m->mKey.Set("$tex.mapping");
            m->mIndex    = prop->mIndex;
            m->mSemantic = prop->mSemantic;
            m->mType     = aiPTI_Integer;

            m->mDataLength = 4;
            m->mData = new char[4];
            *((int*)m->mData) = mode;

            p.push_back(prop);
            p.push_back(m);

            // Setup the mapping axis
            if (mode == aiTextureMapping_CYLINDER || mode == aiTextureMapping_PLANE || mode == aiTextureMapping_SPHERE) {
                m = new aiMaterialProperty();
                m->mKey.Set("$tex.mapaxis");
                m->mIndex    = prop->mIndex;
                m->mSemantic = prop->mSemantic;
                m->mType     = aiPTI_Float;

                m->mDataLength = 12;
                m->mData = new char[12];
                *((aiVector3D*)m->mData) = axis;
                p.push_back(m);
            }
        }
        else if (! ::strcmp( prop->mKey.data, "$tex.uvwsrc"))   {
            delete mat->mProperties[i];
        }
        else p.push_back(prop);
    }

    if (p.empty())return;

    // rebuild the output array
    if (p.size() > mat->mNumAllocated)  {
        delete[] mat->mProperties;
        mat->mProperties = new aiMaterialProperty*[p.size()*2];

        mat->mNumAllocated = static_cast<unsigned int>(p.size()*2);
    }
    mat->mNumProperties = (unsigned int)p.size();
    ::memcpy(mat->mProperties,&p[0],sizeof(void*)*mat->mNumProperties);
}